

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

_Bool chck_string_set_cstr_with_length(chck_string *string,char *data,size_t len,_Bool is_heap)

{
  _Bool _Var1;
  char *__dest;
  
  if (string == (chck_string *)0x0) {
    __assert_fail("string",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/string/string.c"
                  ,0x21,
                  "_Bool chck_string_set_cstr_with_length(struct chck_string *, const char *, size_t, _Bool)"
                 );
  }
  __dest = data;
  if (len == 0 || (!is_heap || data == (char *)0x0)) {
LAB_00101266:
    chck_string_release(string);
    if (len == 0) {
      __dest = (char *)0x0;
    }
    string->is_heap = is_heap;
    string->data = __dest;
    string->size = len;
    _Var1 = true;
  }
  else {
    if (len + 1 != 0) {
      __dest = (char *)calloc(1,len + 1);
      if (__dest != (char *)0x0) {
        memcpy(__dest,data,len);
        goto LAB_00101266;
      }
    }
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

bool
chck_string_set_cstr_with_length(struct chck_string *string, const char *data, size_t len, bool is_heap)
{
   assert(string);

   char *copy = (char*)data;
   if (is_heap && data && len > 0 && !(copy = ccopy(data, len)))
      return false;

   chck_string_release(string);
   string->is_heap = is_heap;
   string->data = (len > 0 ? copy : NULL);
   string->size = len;
   return true;
}